

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_setuservalue(lua_State *L,int idx)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  TValue *pTVar3;
  Udata *iu;
  TValue *io;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar3 = index2addr(L,idx);
  pTVar1 = L->top;
  p_Var2 = (pTVar3->value_).f;
  *(Value *)(p_Var2 + 0x20) = pTVar1[-1].value_;
  p_Var2[10] = SUB41(pTVar1[-1].tt_,0);
  if ((((L->top[-1].tt_ & 0x40U) != 0) && ((((pTVar3->value_).gc)->marked & 4) != 0)) &&
     (((L->top[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrier_(L,(pTVar3->value_).gc,L->top[-1].value_.gc);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_setuservalue(lua_State *L, int idx) {
    StkId o;
    lua_lock(L);
    api_checknelems(L, 1);
    o = index2addr(L, idx);
    api_check(L, ttisfulluserdata(o), "full userdata expected");
    setuservalue(L, uvalue(o), L->top - 1);
    luaC_barrier(L, gcvalue(o), L->top - 1);
    L->top--;
    lua_unlock(L);
}